

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFloatingBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *param_2,LinkNetExternalWrenches *netExtWrenches,
          LinkInternalWrenches *linkJointWrenches,JointDOFsDoubleArray *param_5,
          JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  double *pdVar1;
  void *pvVar2;
  undefined8 uVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  Twist *pTVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  undefined8 *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  JointIndex idx;
  long lVar19;
  Index size;
  IndexRange IVar20;
  ClassicalAcc sensorProperAcc;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  SpatialAcc local_98;
  undefined8 local_68 [4];
  undefined8 uStack_48;
  undefined8 local_40;
  
  iDynTree::VectorDynSize::resize((ulong)d);
  lVar7 = iDynTree::Model::getNrOfLinks();
  if (0 < lVar7) {
    lVar7 = 0;
    do {
      pTVar8 = (Twist *)iDynTree::LinkAccArray::operator()(properAccs,lVar7);
      iDynTree::LinkVelArray::operator()(&this->m_linkVels,lVar7);
      iDynTree::ClassicalAcc::fromSpatial(&local_98,pTVar8);
      IVar20 = getRangeLinkVariable(this,LINK_BODY_PROPER_CLASSICAL_ACCELERATION,lVar7);
      uVar17 = IVar20.size;
      lVar9 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar10 = IVar20.offset * 8 + lVar9;
      uVar16 = uVar17;
      if (((uVar10 & 7) == 0) &&
         (uVar16 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar17 <= (long)uVar16)) {
        uVar16 = uVar17;
      }
      if (0 < (long)uVar16) {
        uVar18 = 0;
        do {
          *(double *)(uVar10 + uVar18 * 8) =
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
      lVar9 = uVar17 - uVar16;
      uVar18 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar9) {
        do {
          dVar4 = *(double *)
                   ((long)local_98.super_SpatialMotionVector.
                          super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                          super_Vector3.m_data + uVar16 * 8 + 8);
          pdVar1 = (double *)(uVar10 + uVar16 * 8);
          *pdVar1 = local_98.super_SpatialMotionVector.
                    super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                    m_data[uVar16];
          pdVar1[1] = dVar4;
          uVar16 = uVar16 + 2;
        } while ((long)uVar16 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar17) {
        do {
          *(double *)(uVar10 + uVar18 * 8) =
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      IVar20 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar7);
      uVar10 = IVar20.size;
      lVar9 = IVar20.offset;
      lVar11 = iDynTree::LinkWrenches::operator()(netExtWrenches,lVar7);
      local_68[0] = *(undefined8 *)(lVar11 + 8);
      local_68[1] = *(undefined8 *)(lVar11 + 0x10);
      local_68[2] = *(undefined8 *)(lVar11 + 0x18);
      local_68[3] = *(undefined8 *)(lVar11 + 0x20);
      uStack_48 = *(undefined8 *)(lVar11 + 0x28);
      local_40 = *(undefined8 *)(lVar11 + 0x30);
      lVar11 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar2 = (void *)(lVar11 + lVar9 * 8);
      uVar16 = uVar10;
      if ((((ulong)pvVar2 & 7) == 0) &&
         (uVar16 = (ulong)((uint)((ulong)pvVar2 >> 3) & 1), (long)uVar10 <= (long)uVar16)) {
        uVar16 = uVar10;
      }
      if (0 < (long)uVar16) {
        memcpy(pvVar2,local_68,uVar16 * 8);
      }
      lVar12 = uVar10 - uVar16;
      lVar19 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar12) {
        lVar13 = uVar16 + 2;
        if ((long)(uVar16 + 2) < lVar19) {
          lVar13 = lVar19;
        }
        memcpy((void *)(lVar11 + (lVar9 + uVar16) * 8),local_68 + uVar16,
               (~uVar16 + lVar13 & 0xfffffffffffffffe) * 8 + 0x10);
      }
      if (lVar19 < (long)uVar10) {
        memcpy((void *)(lVar11 + (lVar12 / 2) * 0x10 + lVar9 * 8 + uVar16 * 8),
               local_68 + (lVar12 / 2) * 2 + uVar16,(uVar10 - lVar19) * 8);
      }
      lVar7 = lVar7 + 1;
      lVar9 = iDynTree::Model::getNrOfLinks();
    } while (lVar7 < lVar9);
  }
  lVar7 = iDynTree::Model::getNrOfJoints();
  if (0 < lVar7) {
    idx = 0;
    do {
      plVar14 = (long *)iDynTree::Model::getJoint((long)this);
      lVar7 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                        ((Model *)&this->m_dynamicsTraversal,(long)this);
      IVar20 = getRangeJointVariable(this,JOINT_WRENCH,idx);
      uVar10 = IVar20.size;
      lVar9 = IVar20.offset;
      lVar7 = iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar7);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[0] = *(double *)(lVar7 + 8);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[1] = *(double *)(lVar7 + 0x10);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[2] = *(double *)(lVar7 + 0x18);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[0] = *(double *)(lVar7 + 0x20);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[1] = *(double *)(lVar7 + 0x28);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[2] = *(double *)(lVar7 + 0x30);
      lVar7 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar2 = (void *)(lVar7 + lVar9 * 8);
      uVar16 = uVar10;
      if ((((ulong)pvVar2 & 7) == 0) &&
         (uVar16 = (ulong)((uint)((ulong)pvVar2 >> 3) & 1), (long)uVar10 <= (long)uVar16)) {
        uVar16 = uVar10;
      }
      if (0 < (long)uVar16) {
        memcpy(pvVar2,&local_98,uVar16 * 8);
      }
      lVar11 = uVar10 - uVar16;
      lVar12 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar11) {
        lVar19 = uVar16 + 2;
        if ((long)(uVar16 + 2) < lVar12) {
          lVar19 = lVar12;
        }
        memcpy((void *)(lVar7 + (uVar16 + lVar9) * 8),
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data + uVar16,
               (~uVar16 + lVar19 & 0xfffffffffffffffe) * 8 + 0x10);
      }
      if (lVar12 < (long)uVar10) {
        memcpy((void *)(lVar7 + (lVar11 / 2) * 0x10 + lVar9 * 8 + uVar16 * 8),
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data + (lVar11 / 2) * 2U + uVar16,(uVar10 - lVar12) * 8);
      }
      iVar5 = (**(code **)(*plVar14 + 0x20))(plVar14);
      if (iVar5 != 0) {
        iVar5 = (**(code **)(*plVar14 + 0x20))(plVar14);
        if (iVar5 != 0) {
          uVar16 = 0;
          do {
            lVar7 = (**(code **)(*plVar14 + 0xc0))(plVar14);
            IVar20 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar7 + uVar16);
            puVar15 = (undefined8 *)
                      iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,lVar7 + uVar16)
            ;
            uVar3 = *puVar15;
            puVar15 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar20.offset);
            *puVar15 = uVar3;
            uVar16 = uVar16 + 1;
            uVar6 = (**(code **)(*plVar14 + 0x20))(plVar14);
          } while (uVar16 < uVar6);
        }
      }
      idx = idx + 1;
      lVar7 = iDynTree::Model::getNrOfJoints();
    } while (idx < lVar7);
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFloatingBase(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& /*netTotalWrenchesWithoutGrav*/,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray&,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    d.resize(this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == BERDY_FLOATING_BASE);

    for (LinkIndex link = 0; link < static_cast<LinkIndex>(m_model.getNrOfLinks()); ++link)
    {
        // Handle acceleration
        // Convert left trivialized proper acceleration to sensor proper acceleration
        ClassicalAcc sensorProperAcc;

        sensorProperAcc.fromSpatial(properAccs(link), m_linkVels(link));
        setSubVector(d, getRangeLinkVariable(LINK_BODY_PROPER_CLASSICAL_ACCELERATION, link), toEigen(sensorProperAcc));

        // Handle external force
        setSubVector(d, getRangeLinkVariable(NET_EXT_WRENCH, link), toEigen(netExtWrenches(link)));

    }

    for (JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); ++jntIdx)
    {
        IJointPtr joint = m_model.getJoint(jntIdx);

        // Handle joint wrench
        // Warning: for legacy reason linkJointWrenches is addressed using the child link index of its joint
        LinkIndex childLinkIndex = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model, jntIdx);
        setSubVector(d, getRangeJointVariable(JOINT_WRENCH, jntIdx), toEigen(linkJointWrenches(childLinkIndex)));

        // If the joint is not fixed, we also need to serialize the acceleration of the relative dof
        if (joint->getNrOfDOFs() > 0)
        {
            for (unsigned int localDof = 0; localDof < joint->getNrOfDOFs(); localDof++)
            {
                DOFIndex dofIdx =  joint->getDOFsOffset() + localDof;
                setSubVector(d, getRangeDOFVariable(DOF_ACCELERATION, dofIdx), jointAccs(dofIdx));
            }
        }
    }


    return true;
}